

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::internal::(anonymous_namespace)::InternalFeatureHelperTest_GetResolvedSourceFeatureExtension_Test>
::CreateTest(TestFactoryImpl<google::protobuf::internal::(anonymous_namespace)::InternalFeatureHelperTest_GetResolvedSourceFeatureExtension_Test>
             *this)

{
  InternalFeatureHelperTest *this_00;
  
  this_00 = (InternalFeatureHelperTest *)operator_new(0x88);
  google::protobuf::internal::InternalFeatureHelperTest::InternalFeatureHelperTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__InternalFeatureHelperTest_01618e70;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }